

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT_internal.c
# Opt level: O1

void FACT_INTERNAL_DestroySound(FACTSoundInstance *sound)

{
  uint8_t *puVar1;
  FACTWave *pFVar2;
  FACTCue *cue;
  long lVar3;
  ulong uVar4;
  
  sound->parentCue->playingSound = (FACTSoundInstance *)0x0;
  if (sound->sound->trackCount != '\0') {
    lVar3 = 0;
    uVar4 = 0;
    do {
      pFVar2 = *(FACTWave **)((long)&(sound->tracks->activeWave).wave + lVar3);
      if (pFVar2 != (FACTWave *)0x0) {
        FACTWave_Destroy(pFVar2);
      }
      pFVar2 = *(FACTWave **)((long)&(sound->tracks->upcomingWave).wave + lVar3);
      if (pFVar2 != (FACTWave *)0x0) {
        FACTWave_Destroy(pFVar2);
      }
      (*sound->parentCue->parentBank->parentEngine->pFree)
                (*(void **)((long)&sound->tracks->events + lVar3));
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0x68;
    } while (uVar4 < sound->sound->trackCount);
  }
  (*sound->parentCue->parentBank->parentEngine->pFree)(sound->tracks);
  uVar4 = (ulong)sound->sound->category;
  if (uVar4 != 0xffff) {
    puVar1 = &sound->parentCue->parentBank->parentEngine->categories[uVar4].instanceCount;
    *puVar1 = *puVar1 + 0xff;
  }
  cue = sound->parentCue;
  cue->state = cue->state & 0xffffffc7 | 0x20;
  puVar1 = &cue->data->instanceCount;
  *puVar1 = *puVar1 + 0xff;
  FACT_INTERNAL_SendCueNotification(cue,NOTIFY_CUESTOP,'\x03');
  (*sound->parentCue->parentBank->parentEngine->pFree)(sound);
  return;
}

Assistant:

void FACT_INTERNAL_DestroySound(FACTSoundInstance *sound)
{
	uint8_t i;

	sound->parentCue->playingSound = NULL;
	for (i = 0; i < sound->sound->trackCount; i += 1)
	{
		if (sound->tracks[i].activeWave.wave != NULL)
		{
			FACTWave_Destroy(
				sound->tracks[i].activeWave.wave
			);
		}
		if (sound->tracks[i].upcomingWave.wave != NULL)
		{
			FACTWave_Destroy(
				sound->tracks[i].upcomingWave.wave
			);
		}
		sound->parentCue->parentBank->parentEngine->pFree(
			sound->tracks[i].events
		);
	}
	sound->parentCue->parentBank->parentEngine->pFree(sound->tracks);

	if (sound->sound->category != FACTCATEGORY_INVALID)
	{
		sound->parentCue->parentBank->parentEngine->categories[
			sound->sound->category
		].instanceCount -= 1;
	}

	/* TODO: if (sound->parentCue->playingSounds == NULL) */
	{
		sound->parentCue->state |= FACT_STATE_STOPPED;
		sound->parentCue->state &= ~(FACT_STATE_PLAYING | FACT_STATE_STOPPING);
		sound->parentCue->data->instanceCount -= 1;

		FACT_INTERNAL_SendCueNotification(sound->parentCue, NOTIFY_CUESTOP, FACTNOTIFICATIONTYPE_CUESTOP);
	}
	sound->parentCue->parentBank->parentEngine->pFree(sound);
}